

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscUtil.c
# Opt level: O0

Gia_Man_t * Gia_ManDropContained(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  Vec_Int_t *p_01;
  sat_solver *s;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int *piVar6;
  bool bVar7;
  int iObj;
  int status;
  int i;
  int ConstLit;
  sat_solver *pSat;
  Vec_Int_t *vKeep;
  Vec_Int_t *vLits;
  Gia_Obj_t *pObj;
  Cnf_Dat_t *pDat;
  Aig_Man_t *pMan;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  pAig = Gia_ManToAigSimple(p);
  iVar1 = Gia_ManPoNum(p);
  p_00 = Cnf_Derive(pAig,iVar1);
  iVar1 = Abc_Var2Lit(*p_00->pVarNums,0);
  Aig_ManStop(pAig);
  iVar2 = Gia_ManPoNum(p);
  p_01 = Vec_IntAlloc(iVar2);
  iObj = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum(p);
    bVar7 = false;
    if (iObj < iVar2) {
      vLits = (Vec_Int_t *)Gia_ManCo(p,iObj);
      bVar7 = vLits != (Vec_Int_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjId(p,(Gia_Obj_t *)vLits);
    iVar2 = Abc_Var2Lit(p_00->pVarNums[iVar2],1);
    Vec_IntPush(p_01,iVar2);
    iObj = iObj + 1;
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,p_00->nVars);
  iObj = 0;
  while( true ) {
    if (p_00->nClauses <= iObj) {
      Cnf_DataFree(p_00);
      iVar2 = sat_solver_simplify(s);
      if (iVar2 == 0) {
        sat_solver_delete(s);
        Vec_IntFree(p_01);
        p_local = (Gia_Man_t *)0x0;
      }
      else {
        iVar2 = Gia_ManPoNum(p);
        p_02 = Vec_IntAlloc(iVar2);
        iObj = 0;
        while( true ) {
          iVar2 = Gia_ManPoNum(p);
          bVar7 = false;
          if (iObj < iVar2) {
            pGVar4 = Gia_ManCo(p,iObj);
            bVar7 = pGVar4 != (Gia_Obj_t *)0x0;
          }
          if (!bVar7) break;
          iVar2 = Vec_IntEntry(p_01,iObj);
          iVar2 = Abc_LitNot(iVar2);
          Vec_IntWriteEntry(p_01,iObj,iVar2);
          piVar6 = Vec_IntArray(p_01);
          piVar5 = Vec_IntArray(p_01);
          iVar2 = Vec_IntSize(p_01);
          iVar2 = sat_solver_solve(s,piVar6,piVar5 + iVar2,0,0,0,0);
          iVar3 = Vec_IntEntry(p_01,iObj);
          iVar3 = Abc_LitNot(iVar3);
          Vec_IntWriteEntry(p_01,iObj,iVar3);
          if (iVar2 == -1) {
            Vec_IntWriteEntry(p_01,iObj,iVar1);
          }
          else {
            Vec_IntPush(p_02,iObj);
          }
          iObj = iObj + 1;
        }
        sat_solver_delete(s);
        Vec_IntFree(p_01);
        iVar1 = Vec_IntSize(p_02);
        iVar2 = Gia_ManPoNum(p);
        if (iVar1 == iVar2) {
          Vec_IntFree(p_02);
          p_local = Gia_ManDup(p);
        }
        else {
          piVar6 = Vec_IntArray(p_02);
          iVar1 = Vec_IntSize(p_02);
          p_local = Gia_ManDupCones(p,piVar6,iVar1,0);
          Vec_IntFree(p_02);
        }
      }
      return p_local;
    }
    iVar2 = sat_solver_addclause(s,p_00->pClauses[iObj],p_00->pClauses[iObj + 1]);
    if (iVar2 == 0) break;
    iObj = iObj + 1;
  }
  Cnf_DataFree(p_00);
  sat_solver_delete(s);
  Vec_IntFree(p_01);
  return (Gia_Man_t *)0x0;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Gia_ManDropContained( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Man_t * pMan = Gia_ManToAigSimple( p );
    Cnf_Dat_t * pDat = Cnf_Derive( pMan, Gia_ManPoNum(p) );
    Gia_Obj_t * pObj;
    Vec_Int_t * vLits, * vKeep;
    sat_solver * pSat;
    int ConstLit = Abc_Var2Lit(pDat->pVarNums[0], 0);
    int i, status;//, Count = 0;
    Aig_ManStop( pMan );

    vLits = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        int iObj = Gia_ObjId( p, pObj );
        Vec_IntPush( vLits, Abc_Var2Lit(pDat->pVarNums[iObj], 1) );
    }

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pDat->nVars );
    for ( i = 0; i < pDat->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pDat->pClauses[i], pDat->pClauses[i+1] ) )
        {
            Cnf_DataFree( pDat );
            sat_solver_delete( pSat );
            Vec_IntFree( vLits );
            return NULL;
        }
    }
    Cnf_DataFree( pDat );
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        Vec_IntFree( vLits );
        return NULL;
    }

    // iterate over POs
    vKeep = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachPo( p, pObj, i )
    {
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits,i)) );
        if ( status == l_False )
            Vec_IntWriteEntry( vLits, i, ConstLit ); // const1 SAT var is always true
        else 
        {
            assert( status = l_True );
            Vec_IntPush( vKeep, i );
        }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( Vec_IntSize(vKeep) == Gia_ManPoNum(p) )
    {
        Vec_IntFree( vKeep );
        return Gia_ManDup(p);
    }
    pNew = Gia_ManDupCones( p, Vec_IntArray(vKeep), Vec_IntSize(vKeep), 0 );
    Vec_IntFree( vKeep );
    return pNew;
}